

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

StringRef __thiscall llvm::sys::path::remove_leading_dotslash(path *this,StringRef Path,Style style)

{
  path *ppVar1;
  char *pcVar2;
  char *pcVar3;
  StringRef SVar4;
  
  pcVar3 = Path.Data;
joined_r0x00159b29:
  do {
    pcVar2 = pcVar3;
    ppVar1 = this;
    if ((pcVar2 < (char *)0x3) || (*ppVar1 != (path)0x2e)) {
LAB_00159b95:
      SVar4.Length = (size_t)pcVar2;
      SVar4.Data = (char *)ppVar1;
      return SVar4;
    }
    if ((ppVar1[1] != (path)0x2f) && ((int)Path.Length != 0 || ppVar1[1] != (path)0x5c))
    goto LAB_00159b95;
    this = ppVar1 + 2;
    pcVar3 = pcVar2 + -2;
    if (pcVar3 != (char *)0x0) {
      do {
        if ((*this != (path)0x2f) && ((int)Path.Length != 0 || *this != (path)0x5c))
        goto joined_r0x00159b29;
        this = this + 1;
        pcVar3 = pcVar3 + -1;
      } while (pcVar3 != (char *)0x0);
      this = ppVar1 + (long)pcVar2;
      pcVar3 = (char *)0x0;
    }
  } while( true );
}

Assistant:

StringRef remove_leading_dotslash(StringRef Path, Style style) {
  // Remove leading "./" (or ".//" or "././" etc.)
  while (Path.size() > 2 && Path[0] == '.' && is_separator(Path[1], style)) {
    Path = Path.substr(2);
    while (Path.size() > 0 && is_separator(Path[0], style))
      Path = Path.substr(1);
  }
  return Path;
}